

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeToFieldMask
          (FieldMaskTree *this,string *prefix,Node *node,FieldMask *out)

{
  size_type *psVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string current_path;
  
  current_path.field_2._8_8_ = node;
  if (prefix[1]._M_string_length == 0) {
    if (*(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
      FieldMask::add_paths((FieldMask *)node,(string *)this);
      return;
    }
  }
  else {
    p_Var5 = *(_Rb_tree_node_base **)((long)&prefix->field_2 + 8);
    if (p_Var5 != (_Rb_tree_node_base *)&prefix->_M_string_length) {
      psVar1 = &current_path._M_string_length;
      do {
        lVar2 = *(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header;
        if (lVar2 == 0) {
          __str.field_2._8_8_ = psVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&__str.field_2 + 8),*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        }
        else {
          local_78 = &__str._M_string_length;
          lVar3 = *(long *)&(this->root_).children._M_t._M_impl;
          std::__cxx11::string::_M_construct<char*>((string *)&local_78,lVar3,lVar2 + lVar3);
          std::__cxx11::string::append((char *)&local_78);
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(p_Var5 + 1))
          ;
          out = (FieldMask *)(plVar4 + 2);
          if ((FieldMask *)*plVar4 == out) {
            current_path._M_string_length =
                 (size_type)(out->super_Message).super_MessageLite._vptr_MessageLite;
            current_path.field_2._M_allocated_capacity = plVar4[3];
            __str.field_2._8_8_ = psVar1;
          }
          else {
            current_path._M_string_length =
                 (size_type)(out->super_Message).super_MessageLite._vptr_MessageLite;
            __str.field_2._8_8_ = (FieldMask *)*plVar4;
          }
          current_path._M_dataplus._M_p = (pointer)plVar4[1];
          *plVar4 = (long)out;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_78 != &__str._M_string_length) {
            operator_delete(local_78);
          }
        }
        MergeToFieldMask((FieldMaskTree *)((long)&__str.field_2 + 8),*(string **)(p_Var5 + 2),
                         (Node *)current_path.field_2._8_8_,out);
        if ((size_type *)__str.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str.field_2._8_8_);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&prefix->_M_string_length);
    }
  }
  return;
}

Assistant:

void FieldMaskTree::MergeToFieldMask(const std::string& prefix,
                                     const Node* node, FieldMask* out) {
  if (node->children.empty()) {
    if (prefix.empty()) {
      // This is the root node.
      return;
    }
    out->add_paths(prefix);
    return;
  }
  for (std::map<std::string, Node*>::const_iterator it = node->children.begin();
       it != node->children.end(); ++it) {
    std::string current_path =
        prefix.empty() ? it->first : prefix + "." + it->first;
    MergeToFieldMask(current_path, it->second, out);
  }
}